

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::blueprint_helpers::generateFractionStem
               (int32_t minFrac,int32_t maxFrac,UnicodeString *sb,UErrorCode *param_4)

{
  int iVar1;
  UChar local_32 [9];
  
  if (maxFrac == 0 && minFrac == 0) {
    icu_63::UnicodeString::doAppend(sb,L"precision-integer",0,-1);
  }
  else {
    local_32[0] = L'.';
    icu_63::UnicodeString::doAppend(sb,local_32,0,1);
    iVar1 = minFrac;
    if (0 < minFrac) {
      do {
        icu_63::UnicodeString::append(sb,0x30);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    if (maxFrac == -1) {
      local_32[0] = L'+';
      icu_63::UnicodeString::doAppend(sb,local_32,0,1);
    }
    else {
      iVar1 = maxFrac - minFrac;
      if (iVar1 != 0 && minFrac <= maxFrac) {
        do {
          icu_63::UnicodeString::append(sb,0x23);
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
    }
  }
  return;
}

Assistant:

void
blueprint_helpers::generateFractionStem(int32_t minFrac, int32_t maxFrac, UnicodeString& sb, UErrorCode&) {
    if (minFrac == 0 && maxFrac == 0) {
        sb.append(u"precision-integer", -1);
        return;
    }
    sb.append(u'.');
    appendMultiple(sb, u'0', minFrac);
    if (maxFrac == -1) {
        sb.append(u'+');
    } else {
        appendMultiple(sb, u'#', maxFrac - minFrac);
    }
}